

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

ParticleUpperBound * __thiscall
despot::BaseTag::CreateParticleUpperBound(BaseTag *this,string *name)

{
  int iVar1;
  TagManhattanUpperBound *this_00;
  TagSPParticleUpperBound *this_01;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_01 = (TagSPParticleUpperBound *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_01,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      this_01 = (TagSPParticleUpperBound *)operator_new(0x38);
      despot::MDPUpperBound::MDPUpperBound
                ((MDPUpperBound *)this_01,&this->super_MDP,&this->super_StateIndexer);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0)) {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          this_00 = (TagManhattanUpperBound *)operator_new(0x30);
          TagManhattanUpperBound::TagManhattanUpperBound(this_00,this);
          return &this_00->super_ParticleUpperBound;
        }
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unsupported particle lower bound: ",0x22);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length)
          ;
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Supported types: TRIVIAL, MDP, SP, MANHATTAN (default to SP)");
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
      this_01 = (TagSPParticleUpperBound *)operator_new(0x28);
      TagSPParticleUpperBound::TagSPParticleUpperBound(this_01,this);
    }
  }
  return &this_01->super_ParticleUpperBound;
}

Assistant:

ParticleUpperBound* BaseTag::CreateParticleUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return  new TrivialParticleUpperBound(this);
	} else if (name == "MDP") {
		return new MDPUpperBound(this, *this);
	} else if (name == "SP" || name == "DEFAULT") {
		return new TagSPParticleUpperBound(this);
	} else if (name == "MANHATTAN") {
		return new TagManhattanUpperBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported particle lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, SP, MANHATTAN (default to SP)" << endl;
		exit(1);
		return NULL;
	}
}